

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O0

optional<pbrt::BSDFSample> * __thiscall
pbrt::ConductorBxDF::Sample_f
          (ConductorBxDF *this,Vector3f wo,Float uc,Point2f u,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Vector3f w;
  Vector3f w_00;
  Vector3f w_01;
  long lVar4;
  Vector3f wi_00;
  SampledSpectrum k;
  SampledSpectrum eta;
  SampledSpectrum eta_00;
  SampledSpectrum f_00;
  Vector3<float> v2;
  Vector3<float> v2_00;
  Vector3f wo_00;
  Vector3f wm_00;
  Vector3f n;
  Vector3f wo_01;
  Vector3f wp;
  Vector3f w_02;
  Vector3f w_03;
  Vector3f wi_01;
  SampledSpectrum f_01;
  bool bVar5;
  int iVar6;
  BxDFReflTransFlags in_ECX;
  undefined8 in_RSI;
  optional<pbrt::BSDFSample> *in_RDI;
  Float FVar7;
  float fVar8;
  Float FVar9;
  Float FVar10;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 auVar11 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar12 [64];
  undefined1 auVar14 [64];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar16 [64];
  undefined1 extraout_var_03 [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  float in_XMM1_Da;
  float fVar20;
  undefined1 auVar27 [56];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 in_ZMM3 [64];
  Vector3f VVar28;
  SampledSpectrum SVar29;
  SampledSpectrum f;
  SampledSpectrum F;
  Float cosTheta_i;
  Float cosTheta_o;
  Float pdf;
  Vector3f wi;
  Vector3f wm;
  SampledSpectrum f_1;
  Vector3f wi_1;
  float in_stack_fffffffffffffb98;
  float in_stack_fffffffffffffb9c;
  undefined4 uVar30;
  Float a;
  undefined4 uVar31;
  Float cosTheta_i_00;
  undefined8 in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbc0;
  float in_stack_fffffffffffffbc4;
  undefined8 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  float in_stack_fffffffffffffbd4;
  float in_stack_fffffffffffffbdc;
  TrowbridgeReitzDistribution *in_stack_fffffffffffffbe0;
  Tuple3<pbrt::Vector3,_float> in_stack_fffffffffffffbe8;
  Tuple3<pbrt::Vector3,_float> in_stack_fffffffffffffbf8;
  Tuple3<pbrt::Vector3,_float> in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  undefined8 in_stack_fffffffffffffc48;
  float in_stack_fffffffffffffc50;
  undefined8 in_stack_fffffffffffffc78;
  float in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffc98;
  float in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  BSDFSample local_104;
  undefined8 local_d8;
  float local_d0;
  undefined8 local_c8;
  float local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_90;
  float local_88;
  undefined8 local_80;
  float local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  float local_48;
  undefined8 local_30;
  Tuple2<pbrt::Point2,_float> local_28;
  Tuple2<pbrt::Point2,_float> local_18;
  float local_10;
  undefined1 auVar13 [64];
  undefined1 auVar15 [64];
  undefined1 auVar19 [56];
  undefined1 auVar23 [64];
  
  uVar30 = SUB84(in_RDI,0);
  a = (Float)((ulong)in_RDI >> 0x20);
  local_28 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(in_ZMM0._0_16_);
  local_30 = vmovlpd_avx(in_ZMM3._0_16_);
  uVar31 = (undefined4)in_RSI;
  cosTheta_i_00 = (Float)((ulong)in_RSI >> 0x20);
  local_18 = local_28;
  local_10 = in_XMM1_Da;
  iVar6 = operator&(in_ECX,Reflection);
  if (iVar6 == 0) {
    memset(in_RDI,0,0x30);
    pstd::optional<pbrt::BSDFSample>::optional(in_RDI);
  }
  else {
    bVar5 = TrowbridgeReitzDistribution::EffectivelySmooth((TrowbridgeReitzDistribution *)0x66fae1);
    if (bVar5) {
      Vector3<float>::Vector3
                ((Vector3<float> *)in_RDI,in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98,0.0);
      local_78 = local_48;
      local_80 = local_50;
      local_88 = local_48;
      local_90 = local_50;
      VVar28.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar31;
      VVar28.super_Tuple3<pbrt::Vector3,_float>.x = a;
      VVar28.super_Tuple3<pbrt::Vector3,_float>.z = cosTheta_i_00;
      AbsCosTheta(VVar28);
      lVar4 = CONCAT44(cosTheta_i_00,uVar31);
      local_a8 = *(undefined8 *)(lVar4 + 8);
      uStack_a0 = *(undefined8 *)(lVar4 + 0x10);
      local_b8 = *(undefined8 *)(lVar4 + 0x18);
      uStack_b0 = *(undefined8 *)(lVar4 + 0x20);
      auVar27 = ZEXT856(0);
      eta.values.values[2] = (float)in_stack_fffffffffffffbd0;
      eta.values.values[0] = (float)(int)in_stack_fffffffffffffbc8;
      eta.values.values[1] = (float)(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
      eta.values.values[3] = in_stack_fffffffffffffbd4;
      SVar29.values.values[2] = (float)in_stack_fffffffffffffbc0;
      SVar29.values.values[0] = (float)(int)in_stack_fffffffffffffbb8;
      SVar29.values.values[1] = (float)(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
      SVar29.values.values[3] = in_stack_fffffffffffffbc4;
      auVar19 = extraout_var;
      SVar29 = FrComplex(cosTheta_i_00,eta,SVar29);
      auVar21._0_8_ = SVar29.values.values._8_8_;
      auVar21._8_56_ = auVar27;
      auVar11._0_8_ = SVar29.values.values._0_8_;
      auVar11._8_56_ = auVar19;
      local_70 = vmovlpd_avx(auVar11._0_16_);
      local_68 = vmovlpd_avx(auVar21._0_16_);
      local_c0 = local_48;
      local_c8 = local_50;
      local_d0 = local_48;
      local_d8 = local_50;
      auVar27 = (undefined1  [56])0x0;
      w.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar31;
      w.super_Tuple3<pbrt::Vector3,_float>.x = a;
      w.super_Tuple3<pbrt::Vector3,_float>.z = cosTheta_i_00;
      AbsCosTheta(w);
      auVar19 = extraout_var_00;
      SVar29 = SampledSpectrum::operator/
                         ((SampledSpectrum *)CONCAT44(a,uVar30),(Float)((ulong)in_RDI >> 0x20));
      auVar22._0_8_ = SVar29.values.values._8_8_;
      auVar22._8_56_ = auVar27;
      auVar12._0_8_ = SVar29.values.values._0_8_;
      auVar12._8_56_ = auVar19;
      local_60 = vmovlpd_avx(auVar12._0_16_);
      uStack_58 = vmovlpd_avx(auVar22._0_16_);
      f_01.values.values[2] = (float)(int)uStack_58;
      f_01.values.values[3] = (float)(int)((ulong)uStack_58 >> 0x20);
      f_01.values.values[0] = (float)(int)local_60;
      f_01.values.values[1] = (float)(int)((ulong)local_60 >> 0x20);
      wi_01.super_Tuple3<pbrt::Vector3,_float>.z = local_48;
      wi_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_50;
      wi_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_50._4_4_;
      BSDFSample::BSDFSample(&local_104,f_01,wi_01,1.0,SpecularReflection,1.0,false);
      pstd::optional<pbrt::BSDFSample>::optional
                (in_RDI,(BSDFSample *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98))
      ;
    }
    else if ((local_10 != 0.0) || (NAN(local_10))) {
      auVar19 = ZEXT856(0);
      w_03.super_Tuple3<pbrt::Vector3,_float>.z = local_10;
      w_03.super_Tuple3<pbrt::Vector3,_float>.x = local_18.x;
      w_03.super_Tuple3<pbrt::Vector3,_float>.y = local_18.y;
      VVar28 = TrowbridgeReitzDistribution::Sample_wm
                         ((TrowbridgeReitzDistribution *)
                          CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),w_03,
                          (Point2f)local_18);
      auVar13._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar13._8_56_ = auVar19;
      vmovlpd_avx(auVar13._0_16_);
      auVar19 = ZEXT856(0);
      wo_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffca0;
      wo_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffc98;
      wo_01.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffffc98 >> 0x20);
      n.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc80;
      n.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffc78;
      n.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffffc78 >> 0x20);
      VVar28 = Reflect(wo_01,n);
      fVar20 = VVar28.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar14._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar14._8_56_ = auVar19;
      uVar1 = vmovlpd_avx(auVar14._0_16_);
      w_02.super_Tuple3<pbrt::Vector3,_float>.z = local_10;
      w_02.super_Tuple3<pbrt::Vector3,_float>.x = local_18.x;
      w_02.super_Tuple3<pbrt::Vector3,_float>.y = local_18.y;
      wp.super_Tuple3<pbrt::Vector3,_float>.z = fVar20;
      wp.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
      wp.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
      bVar5 = SameHemisphere(w_02,wp);
      if (bVar5) {
        FVar7 = TrowbridgeReitzDistribution::PDF
                          ((TrowbridgeReitzDistribution *)
                           CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                           (Vector3f)in_stack_fffffffffffffc08,(Vector3f)in_stack_fffffffffffffbe8);
        v2.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffffbe0;
        v2.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffbdc;
        fVar8 = AbsDot<float>((Vector3<float>)in_stack_fffffffffffffbf8,v2);
        fVar8 = FVar7 / (fVar8 * 4.0);
        w_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar31;
        w_00.super_Tuple3<pbrt::Vector3,_float>.x = a;
        w_00.super_Tuple3<pbrt::Vector3,_float>.z = cosTheta_i_00;
        FVar9 = AbsCosTheta(w_00);
        w_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar31;
        w_01.super_Tuple3<pbrt::Vector3,_float>.x = a;
        w_01.super_Tuple3<pbrt::Vector3,_float>.z = cosTheta_i_00;
        FVar10 = AbsCosTheta(w_01);
        if (((FVar10 == 0.0) && (!NAN(FVar10))) || ((FVar9 == 0.0 && (!NAN(FVar9))))) {
          memset(in_RDI,0,0x30);
          pstd::optional<pbrt::BSDFSample>::optional(in_RDI);
        }
        else {
          v2_00.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffffbe0;
          v2_00.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffbdc;
          AbsDot<float>((Vector3<float>)in_stack_fffffffffffffbf8,v2_00);
          auVar27 = ZEXT856(0);
          eta_00.values.values[2] = (float)in_stack_fffffffffffffbd0;
          eta_00.values.values[0] = (float)(int)in_stack_fffffffffffffbc8;
          eta_00.values.values[1] = (float)(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
          eta_00.values.values[3] = in_stack_fffffffffffffbd4;
          k.values.values[2] = (float)in_stack_fffffffffffffbc0;
          k.values.values[0] = (float)(int)in_stack_fffffffffffffbb8;
          k.values.values[1] = (float)(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
          k.values.values[3] = in_stack_fffffffffffffbc4;
          auVar19 = extraout_var_01;
          SVar29 = FrComplex(cosTheta_i_00,eta_00,k);
          auVar23._0_8_ = SVar29.values.values._8_8_;
          auVar23._8_56_ = auVar27;
          auVar15._0_8_ = SVar29.values.values._0_8_;
          auVar15._8_56_ = auVar19;
          vmovlpd_avx(auVar15._0_16_);
          vmovlpd_avx(auVar23._0_16_);
          auVar27 = (undefined1  [56])0x0;
          wm_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc50;
          wm_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffc48;
          wm_00.super_Tuple3<pbrt::Vector3,_float>.y =
               (float)(int)((ulong)in_stack_fffffffffffffc48 >> 0x20);
          TrowbridgeReitzDistribution::D
                    ((TrowbridgeReitzDistribution *)
                     CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),wm_00);
          auVar19 = extraout_var_02;
          SVar29 = pbrt::operator*((Float)((ulong)in_RDI >> 0x20),
                                   (SampledSpectrum *)CONCAT44(FVar7,in_stack_fffffffffffffb98));
          auVar24._0_8_ = SVar29.values.values._8_8_;
          auVar24._8_56_ = auVar27;
          auVar16._0_8_ = SVar29.values.values._0_8_;
          auVar16._8_56_ = auVar19;
          vmovlpd_avx(auVar16._0_16_);
          vmovlpd_avx(auVar24._0_16_);
          auVar27 = (undefined1  [56])0x0;
          wo_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar20;
          wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
          wo_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
          TrowbridgeReitzDistribution::G
                    (in_stack_fffffffffffffbe0,wo_00,(Vector3f)in_stack_fffffffffffffbf8);
          auVar19 = extraout_var_03;
          SVar29 = SampledSpectrum::operator*((SampledSpectrum *)CONCAT44(cosTheta_i_00,uVar31),a);
          auVar25._0_8_ = SVar29.values.values._8_8_;
          auVar25._8_56_ = auVar27;
          auVar17._0_8_ = SVar29.values.values._0_8_;
          auVar17._8_56_ = auVar19;
          vmovlpd_avx(auVar17._0_16_);
          vmovlpd_avx(auVar25._0_16_);
          auVar27 = (undefined1  [56])0x0;
          auVar19 = (undefined1  [56])0x0;
          SVar29 = SampledSpectrum::operator/
                             ((SampledSpectrum *)CONCAT44(a,uVar30),(Float)((ulong)in_RDI >> 0x20));
          auVar26._0_8_ = SVar29.values.values._8_8_;
          auVar26._8_56_ = auVar27;
          auVar18._0_8_ = SVar29.values.values._0_8_;
          auVar18._8_56_ = auVar19;
          uVar2 = vmovlpd_avx(auVar18._0_16_);
          uVar3 = vmovlpd_avx(auVar26._0_16_);
          f_00.values.values[2] = (float)(int)uVar3;
          f_00.values.values[3] = (float)(int)((ulong)uVar3 >> 0x20);
          f_00.values.values[0] = (float)(int)uVar2;
          f_00.values.values[1] = (float)(int)((ulong)uVar2 >> 0x20);
          wi_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar20;
          wi_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
          wi_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
          BSDFSample::BSDFSample
                    ((BSDFSample *)&stack0xfffffffffffffbec,f_00,wi_00,fVar8,GlossyReflection,1.0,
                     false);
          pstd::optional<pbrt::BSDFSample>::optional
                    (in_RDI,(BSDFSample *)CONCAT44(FVar7,in_stack_fffffffffffffb98));
        }
      }
      else {
        memset(in_RDI,0,0x30);
        pstd::optional<pbrt::BSDFSample>::optional(in_RDI);
      }
    }
    else {
      memset(in_RDI,0,0x30);
      pstd::optional<pbrt::BSDFSample>::optional(in_RDI);
    }
  }
  return (optional<pbrt::BSDFSample> *)CONCAT44(a,uVar30);
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<BSDFSample> Sample_f(
        Vector3f wo, Float uc, Point2f u, TransportMode mode,
        BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            return {};
        if (mfDistrib.EffectivelySmooth()) {
            // Sample perfect specular conductor BRDF
            Vector3f wi(-wo.x, -wo.y, wo.z);
            SampledSpectrum f = FrComplex(AbsCosTheta(wi), eta, k) / AbsCosTheta(wi);
            return BSDFSample(f, wi, 1, BxDFFlags::SpecularReflection);
        }
        // Sample rough conductor BRDF
        // Sample microfacet normal $\wm$ and reflected direction $\wi$
        if (wo.z == 0)
            return {};
        Vector3f wm = mfDistrib.Sample_wm(wo, u);
        Vector3f wi = Reflect(wo, wm);
        if (!SameHemisphere(wo, wi))
            return {};

        // Compute PDF of _wi_ for microfacet reflection
        Float pdf = mfDistrib.PDF(wo, wm) / (4 * AbsDot(wo, wm));

        Float cosTheta_o = AbsCosTheta(wo), cosTheta_i = AbsCosTheta(wi);
        if (cosTheta_i == 0 || cosTheta_o == 0)
            return {};
        // Evaluate Fresnel factor _F_ for conductor BRDF
        SampledSpectrum F = FrComplex(AbsDot(wo, wm), eta, k);

        SampledSpectrum f =
            mfDistrib.D(wm) * F * mfDistrib.G(wo, wi) / (4 * cosTheta_i * cosTheta_o);
        return BSDFSample(f, wi, pdf, BxDFFlags::GlossyReflection);
    }